

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O3

int deqp::gles31::Functional::anon_unknown_0::getTargetTexDims(deUint32 target)

{
  if ((int)target < 0x8513) {
    if (target == 0xde0) {
      return 1;
    }
    if (target != 0xde1) {
      if (target == 0x806f) {
        return 3;
      }
      return -1;
    }
  }
  else if (target != 0x8513) {
    if (target == 0x8c1a) {
      return 3;
    }
    if (target != 0x8c18) {
      return -1;
    }
  }
  return 2;
}

Assistant:

int getTargetTexDims (deUint32 target)
{
	DE_ASSERT(isTextureTarget(target));

	switch (target)
	{
		case GL_TEXTURE_1D:
			return 1;

		case GL_TEXTURE_1D_ARRAY:
		case GL_TEXTURE_2D:
		case GL_TEXTURE_CUBE_MAP:
			return 2;

		case GL_TEXTURE_2D_ARRAY:
		case GL_TEXTURE_3D:
			return 3;

		default:
			DE_ASSERT(false);
			return -1;
	}
}